

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::syntax::ExtendsClauseSyntax_const&>
          (BumpAllocator *this,ExtendsClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  NameSyntax *pNVar4;
  ArgumentListSyntax *pAVar5;
  DefaultExtendsClauseArgSyntax *pDVar6;
  undefined4 uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  ExtendsClauseSyntax *pEVar12;
  
  pEVar12 = (ExtendsClauseSyntax *)allocate(this,0x40,8);
  uVar7 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar8 = (args->keyword).kind;
  uVar9 = (args->keyword).field_0x2;
  NVar10.raw = (args->keyword).numFlags.raw;
  uVar11 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  pNVar4 = (args->baseName).ptr;
  pAVar5 = args->arguments;
  pDVar6 = args->defaultedArg;
  (pEVar12->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar12->super_SyntaxNode).field_0x4 = uVar7;
  (pEVar12->super_SyntaxNode).parent = pSVar1;
  (pEVar12->super_SyntaxNode).previewNode = pSVar2;
  (pEVar12->keyword).kind = TVar8;
  (pEVar12->keyword).field_0x2 = uVar9;
  (pEVar12->keyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pEVar12->keyword).rawLen = uVar11;
  (pEVar12->keyword).info = pIVar3;
  (pEVar12->baseName).ptr = pNVar4;
  pEVar12->arguments = pAVar5;
  pEVar12->defaultedArg = pDVar6;
  return pEVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }